

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::VariablePatternSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,VariablePatternSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  VariablePatternSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->dot).kind;
    token._2_1_ = (this->dot).field_0x2;
    token.numFlags.raw = (this->dot).numFlags.raw;
    token.rawLen = (this->dot).rawLen;
    token.info = (this->dot).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->variableName).kind;
    token_00._2_1_ = (this->variableName).field_0x2;
    token_00.numFlags.raw = (this->variableName).numFlags.raw;
    token_00.rawLen = (this->variableName).rawLen;
    token_00.info = (this->variableName).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax VariablePatternSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return dot;
        case 1: return variableName;
        default: return nullptr;
    }
}